

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>::
SimpleDictionaryTypeHandlerBase
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this,
          Recycler *recycler,
          SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *typeHandler
          )

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar6;
  nullptr_t local_28;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *local_20;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *typeHandler_local;
  Recycler *recycler_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this_local;
  
  local_20 = typeHandler;
  typeHandler_local =
       (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *)recycler;
  recycler_local = (Recycler *)this;
  DynamicTypeHandler::DynamicTypeHandler
            (&this->super_DynamicTypeHandler,&typeHandler->super_DynamicTypeHandler);
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_01e4a938
  ;
  Memory::
  WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
  ::WriteBarrierPtr(&this->propertyMap);
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::WriteBarrierPtr
            (&this->singletonInstance,&local_28);
  this->field_0x28 = this->field_0x28 & 0xfe | local_20->field_0x28 & 1;
  this->field_0x28 = this->field_0x28 & 0xfd | ((byte)local_20->field_0x28 >> 1 & 1) << 1;
  this->field_0x28 = this->field_0x28 & 0xfb | ((byte)local_20->field_0x28 >> 2 & 1) << 2;
  this->numDeletedProperties = local_20->numDeletedProperties;
  this->nextPropertyIndex = local_20->nextPropertyIndex;
  bVar2 = DynamicTypeHandler::GetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
  bVar3 = DynamicTypeHandler::GetIsInlineSlotCapacityLocked(&local_20->super_DynamicTypeHandler);
  if (bVar2 != bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x155,
                                "(this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked())"
                                ,
                                "this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  iVar4 = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler);
  if (0xfffe < iVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x156,"(this->GetSlotCapacity() <= MaxPropertyIndexSize)",
                                "this->GetSlotCapacity() <= MaxPropertyIndexSize");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pBVar6 = Memory::
           WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
           ::operator->(&local_20->propertyMap);
  pBVar6 = JsUtil::
           BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
           ::Clone(pBVar6);
  Memory::
  WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
  ::operator=(&this->propertyMap,pBVar6);
  return;
}

Assistant:

SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SimpleDictionaryTypeHandlerBase(Recycler* recycler, SimpleDictionaryTypeHandlerBase * typeHandler) :
        DynamicTypeHandler(typeHandler),
        nextPropertyIndex(typeHandler->nextPropertyIndex),
        singletonInstance(nullptr),
        _gc_tag(typeHandler->_gc_tag),
        isUnordered(typeHandler->isUnordered),
        hasNamelessPropertyId(typeHandler->hasNamelessPropertyId),
        numDeletedProperties(typeHandler->numDeletedProperties)
    {
        Assert(this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked());
        Assert(this->GetSlotCapacity() <= MaxPropertyIndexSize);
        propertyMap = typeHandler->propertyMap->Clone();
    }